

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

bool __thiscall
testing::internal::ElementsAreMatcherImpl<const_pstore::small_vector<int,_2UL>_&>::MatchAndExplain
          (ElementsAreMatcherImpl<const_pstore::small_vector<int,_2UL>_&> *this,
          small_vector<int,_2UL> *container,MatchResultListener *listener)

{
  ostream *poVar1;
  pointer pbVar2;
  bool bVar3;
  int *piVar4;
  MatchResultListener *pMVar5;
  pointer pMVar6;
  unsigned_long uVar7;
  long lVar8;
  size_t count;
  pointer pMVar9;
  _func_int **pp_Var10;
  bool bVar11;
  int *x;
  long lVar12;
  long local_218;
  unsigned_long local_208;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  explanations;
  string local_1e8 [32];
  StringMatchResultListener s;
  
  poVar1 = listener->stream_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&explanations,
           ((long)(this->matchers_).
                  super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->matchers_).
                 super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x18,(allocator_type *)&s);
  piVar4 = container->buffer_;
  lVar12 = -(long)piVar4;
  local_218 = 0;
  lVar8 = 0;
  uVar7 = 0;
  x = piVar4;
  while( true ) {
    local_208 = uVar7;
    if (x == piVar4 + container->elements_) break;
    pMVar6 = (this->matchers_).
             super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (uVar7 == ((long)(this->matchers_).
                        super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar6) / 0x18) {
      bVar3 = false;
      goto LAB_00152fd8;
    }
    if (poVar1 == (ostream *)0x0) {
      bVar3 = MatcherBase<const_int_&>::Matches
                        ((MatcherBase<const_int_&> *)
                         ((long)&(pMVar6->super_MatcherBase<const_int_&>).
                                 super_MatcherDescriberInterface._vptr_MatcherDescriberInterface +
                         local_218),x);
    }
    else {
      StringMatchResultListener::StringMatchResultListener(&s);
      bVar3 = MatcherBase<const_int_&>::MatchAndExplain
                        ((MatcherBase<const_int_&> *)
                         ((long)&(((this->matchers_).
                                   super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super_MatcherBase<const_int_&>).super_MatcherDescriberInterface.
                                 _vptr_MatcherDescriberInterface + local_218),x,
                         &s.super_MatchResultListener);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=
                ((string *)
                 ((long)&((explanations.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar8),
                 local_1e8);
      std::__cxx11::string::~string(local_1e8);
      StringMatchResultListener::~StringMatchResultListener(&s);
    }
    if (bVar3 == false) {
      bVar3 = true;
      goto LAB_00152fd8;
    }
    x = x + 1;
    uVar7 = uVar7 + 1;
    lVar12 = lVar12 + -4;
    piVar4 = container->buffer_;
    lVar8 = lVar8 + 0x20;
    local_218 = local_218 + 0x18;
  }
  bVar3 = false;
LAB_00152fd8:
  count = ((long)container->buffer_ + lVar12 + container->elements_ * 4 >> 2) + uVar7;
  pMVar6 = (this->matchers_).
           super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar9 = (this->matchers_).
           super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (count == ((long)pMVar9 - (long)pMVar6) / 0x18) {
    if (!bVar3) {
      bVar3 = true;
      if (poVar1 != (ostream *)0x0) {
        pp_Var10 = (_func_int **)0x0;
        bVar11 = false;
        while( true ) {
          pbVar2 = explanations.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          s.super_MatchResultListener._vptr_MatchResultListener = pp_Var10;
          if (pp_Var10 == (_func_int **)(((long)pMVar9 - (long)pMVar6) / 0x18)) break;
          if (explanations.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[(long)pp_Var10]._M_string_length != 0) {
            if (bVar11) {
              MatchResultListener::operator<<(listener,(char (*) [7])",\nand ");
            }
            pMVar5 = MatchResultListener::operator<<(listener,(char (*) [16])"whose element #");
            pMVar5 = MatchResultListener::operator<<(pMVar5,(unsigned_long *)&s);
            pMVar5 = MatchResultListener::operator<<(pMVar5,(char (*) [11])" matches, ");
            MatchResultListener::operator<<(pMVar5,pbVar2 + (long)pp_Var10);
            pMVar6 = (this->matchers_).
                     super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pMVar9 = (this->matchers_).
                     super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            bVar11 = true;
          }
          pp_Var10 = (_func_int **)((long)s.super_MatchResultListener._vptr_MatchResultListener + 1)
          ;
        }
      }
      goto LAB_001530c0;
    }
    if (poVar1 != (ostream *)0x0) {
      pMVar5 = MatchResultListener::operator<<(listener,(char (*) [16])"whose element #");
      pMVar5 = MatchResultListener::operator<<(pMVar5,&local_208);
      MatchResultListener::operator<<(pMVar5,(char (*) [15])" doesn\'t match");
      PrintIfNotEmpty(explanations.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + local_208,listener->stream_);
    }
  }
  else {
    bVar3 = false;
    if ((poVar1 == (ostream *)0x0) || (bVar3 = false, count == 0)) goto LAB_001530c0;
    pMVar5 = MatchResultListener::operator<<(listener,(char (*) [11])"which has ");
    Elements((ElementsAreMatcherImpl<const_pstore::small_vector<int,_2UL>_&> *)&s,count);
    MatchResultListener::operator<<(pMVar5,(Message *)&s);
    if (s.super_MatchResultListener._vptr_MatchResultListener != (_func_int **)0x0) {
      (**(code **)(*s.super_MatchResultListener._vptr_MatchResultListener + 8))();
    }
  }
  bVar3 = false;
LAB_001530c0:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&explanations);
  return bVar3;
}

Assistant:

bool MatchAndExplain(Container container,
                       MatchResultListener* listener) const override {
    // To work with stream-like "containers", we must only walk
    // through the elements in one pass.

    const bool listener_interested = listener->IsInterested();

    // explanations[i] is the explanation of the element at index i.
    ::std::vector<std::string> explanations(count());
    StlContainerReference stl_container = View::ConstReference(container);
    typename StlContainer::const_iterator it = stl_container.begin();
    size_t exam_pos = 0;
    bool mismatch_found = false;  // Have we found a mismatched element yet?

    // Go through the elements and matchers in pairs, until we reach
    // the end of either the elements or the matchers, or until we find a
    // mismatch.
    for (; it != stl_container.end() && exam_pos != count(); ++it, ++exam_pos) {
      bool match;  // Does the current element match the current matcher?
      if (listener_interested) {
        StringMatchResultListener s;
        match = matchers_[exam_pos].MatchAndExplain(*it, &s);
        explanations[exam_pos] = s.str();
      } else {
        match = matchers_[exam_pos].Matches(*it);
      }

      if (!match) {
        mismatch_found = true;
        break;
      }
    }
    // If mismatch_found is true, 'exam_pos' is the index of the mismatch.

    // Find how many elements the actual container has.  We avoid
    // calling size() s.t. this code works for stream-like "containers"
    // that don't define size().
    size_t actual_count = exam_pos;
    for (; it != stl_container.end(); ++it) {
      ++actual_count;
    }

    if (actual_count != count()) {
      // The element count doesn't match.  If the container is empty,
      // there's no need to explain anything as Google Mock already
      // prints the empty container.  Otherwise we just need to show
      // how many elements there actually are.
      if (listener_interested && (actual_count != 0)) {
        *listener << "which has " << Elements(actual_count);
      }
      return false;
    }

    if (mismatch_found) {
      // The element count matches, but the exam_pos-th element doesn't match.
      if (listener_interested) {
        *listener << "whose element #" << exam_pos << " doesn't match";
        PrintIfNotEmpty(explanations[exam_pos], listener->stream());
      }
      return false;
    }

    // Every element matches its expectation.  We need to explain why
    // (the obvious ones can be skipped).
    if (listener_interested) {
      bool reason_printed = false;
      for (size_t i = 0; i != count(); ++i) {
        const std::string& s = explanations[i];
        if (!s.empty()) {
          if (reason_printed) {
            *listener << ",\nand ";
          }
          *listener << "whose element #" << i << " matches, " << s;
          reason_printed = true;
        }
      }
    }
    return true;
  }